

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::type_name_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this,FieldDescriptor *descriptor)

{
  bool bVar1;
  Type TVar2;
  Descriptor *this_00;
  LogMessage *pLVar3;
  undefined1 auVar4 [16];
  LogMessageFatal local_d8 [16];
  Voidify local_c8;
  allocator<char> local_c7;
  allocator<char> local_c6;
  allocator<char> local_c5;
  allocator<char> local_c4;
  allocator<char> local_c3;
  allocator<char> local_c2;
  allocator<char> local_c1;
  allocator<char> local_c0;
  allocator<char> local_bf;
  allocator<char> local_be;
  allocator<char> local_bd;
  allocator<char> local_bc;
  allocator<char> local_bb;
  allocator<char> local_ba;
  allocator<char> local_b9;
  AlphaNum local_b8;
  AlphaNum local_88;
  undefined4 local_58;
  undefined1 local_48 [8];
  string wrapped_field_type_name;
  FieldDescriptor *wrapped_field;
  FieldDescriptor *descriptor_local;
  FieldGeneratorBase *this_local;
  
  TVar2 = FieldDescriptor::type(descriptor);
  switch(TVar2) {
  case TYPE_DOUBLE:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"double",&local_b9);
    std::allocator<char>::~allocator(&local_b9);
    break;
  case TYPE_FLOAT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"float",&local_ba);
    std::allocator<char>::~allocator(&local_ba);
    break;
  case TYPE_INT64:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"long",&local_bb);
    std::allocator<char>::~allocator(&local_bb);
    break;
  case TYPE_UINT64:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ulong",&local_bc);
    std::allocator<char>::~allocator(&local_bc);
    break;
  case TYPE_INT32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"int",&local_bd);
    std::allocator<char>::~allocator(&local_bd);
    break;
  case TYPE_FIXED64:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ulong",&local_be);
    std::allocator<char>::~allocator(&local_be);
    break;
  case TYPE_FIXED32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"uint",&local_bf);
    std::allocator<char>::~allocator(&local_bf);
    break;
  case TYPE_BOOL:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"bool",&local_c0);
    std::allocator<char>::~allocator(&local_c0);
    break;
  case TYPE_STRING:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"string",&local_c1);
    std::allocator<char>::~allocator(&local_c1);
    break;
  case TYPE_GROUP:
  case TYPE_MESSAGE:
    bVar1 = IsWrapperType(descriptor);
    if (bVar1) {
      this_00 = (Descriptor *)google::protobuf::FieldDescriptor::message_type();
      wrapped_field_type_name.field_2._8_8_ = Descriptor::field(this_00,0);
      type_name_abi_cxx11_
                ((string *)local_48,this,(FieldDescriptor *)wrapped_field_type_name.field_2._8_8_);
      TVar2 = FieldDescriptor::type((FieldDescriptor *)wrapped_field_type_name.field_2._8_8_);
      if ((TVar2 == TYPE_STRING) ||
         (TVar2 = FieldDescriptor::type((FieldDescriptor *)wrapped_field_type_name.field_2._8_8_),
         TVar2 == TYPE_BYTES)) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_48);
      }
      else {
        absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
                  (&local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
        absl::lts_20240722::AlphaNum::AlphaNum(&local_b8,"?");
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_88);
      }
      local_58 = 1;
      std::__cxx11::string::~string((string *)local_48);
    }
    else {
      auVar4 = google::protobuf::FieldDescriptor::message_type();
      GetClassName_abi_cxx11_(__return_storage_ptr__,auVar4._0_8_,auVar4._8_8_);
    }
    break;
  case TYPE_BYTES:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"pb::ByteString",&local_c2);
    std::allocator<char>::~allocator(&local_c2);
    break;
  case TYPE_UINT32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"uint",&local_c3);
    std::allocator<char>::~allocator(&local_c3);
    break;
  case TYPE_ENUM:
    auVar4 = google::protobuf::FieldDescriptor::enum_type();
    GetClassName_abi_cxx11_(__return_storage_ptr__,auVar4._0_8_,auVar4._8_8_);
    break;
  case TYPE_SFIXED32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"int",&local_c4);
    std::allocator<char>::~allocator(&local_c4);
    break;
  case TYPE_SFIXED64:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"long",&local_c5);
    std::allocator<char>::~allocator(&local_c5);
    break;
  case TYPE_SINT32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"int",&local_c6);
    std::allocator<char>::~allocator(&local_c6);
    break;
  case MAX_TYPE:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"long",&local_c7);
    std::allocator<char>::~allocator(&local_c7);
    break;
  default:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/csharp/csharp_field_base.cc"
               ,0x103);
    pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_d8);
    pLVar3 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar3,(char (*) [20])"Unknown field type.");
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_c8,pLVar3);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldGeneratorBase::type_name(const FieldDescriptor* descriptor) {
  switch (descriptor->type()) {
    case FieldDescriptor::TYPE_ENUM:
      return GetClassName(descriptor->enum_type());
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
      if (IsWrapperType(descriptor)) {
        const FieldDescriptor* wrapped_field =
            descriptor->message_type()->field(0);
        std::string wrapped_field_type_name = type_name(wrapped_field);
        // String and ByteString go to the same type; other wrapped types
        // go to the nullable equivalent.
        if (wrapped_field->type() == FieldDescriptor::TYPE_STRING ||
            wrapped_field->type() == FieldDescriptor::TYPE_BYTES) {
          return wrapped_field_type_name;
        } else {
          return absl::StrCat(wrapped_field_type_name, "?");
        }
      }
      return GetClassName(descriptor->message_type());
    case FieldDescriptor::TYPE_DOUBLE:
      return "double";
    case FieldDescriptor::TYPE_FLOAT:
      return "float";
    case FieldDescriptor::TYPE_INT64:
      return "long";
    case FieldDescriptor::TYPE_UINT64:
      return "ulong";
    case FieldDescriptor::TYPE_INT32:
      return "int";
    case FieldDescriptor::TYPE_FIXED64:
      return "ulong";
    case FieldDescriptor::TYPE_FIXED32:
      return "uint";
    case FieldDescriptor::TYPE_BOOL:
      return "bool";
    case FieldDescriptor::TYPE_STRING:
      return "string";
    case FieldDescriptor::TYPE_BYTES:
      return "pb::ByteString";
    case FieldDescriptor::TYPE_UINT32:
      return "uint";
    case FieldDescriptor::TYPE_SFIXED32:
      return "int";
    case FieldDescriptor::TYPE_SFIXED64:
      return "long";
    case FieldDescriptor::TYPE_SINT32:
      return "int";
    case FieldDescriptor::TYPE_SINT64:
      return "long";
    default:
      ABSL_LOG(FATAL) << "Unknown field type.";
      return "";
  }
}